

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O3

bool __thiscall
gl3cts::TransformFeedback::DiscardGeometry::checkFramebuffer
          (DiscardGeometry *this,GLuint primitive_case)

{
  float fVar1;
  long *plVar2;
  deUint32 err;
  long lVar3;
  undefined8 *puVar4;
  value_type_conflict2 *__val;
  undefined4 in_register_00000034;
  bool bVar5;
  
  plVar2 = *(long **)(*(long *)(&(this->super_CaptureGeometryInterleaved).field_0x78 +
                               (long)(this->super_CaptureGeometryInterleaved).
                                     _vptr_CaptureGeometryInterleaved[-3]) + 8);
  lVar3 = (**(code **)(*plVar2 + 0x18))(plVar2,CONCAT44(in_register_00000034,primitive_case));
  puVar4 = (undefined8 *)operator_new(0x10);
  *puVar4 = 0;
  puVar4[1] = 0;
  (**(code **)(lVar3 + 0x1220))(0,0,2,2,0x1903,0x1406,puVar4);
  err = (**(code **)(lVar3 + 0x800))();
  glu::checkError(err,"glReadPixels call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x1081);
  lVar3 = 0;
  do {
    fVar1 = *(float *)((long)puVar4 + lVar3);
    if (0.0625 < ABS(fVar1)) break;
    bVar5 = lVar3 != 0xc;
    lVar3 = lVar3 + 4;
  } while (bVar5);
  operator_delete(puVar4,0x10);
  return ABS(fVar1) <= 0.0625;
}

Assistant:

bool gl3cts::TransformFeedback::DiscardGeometry::checkFramebuffer(glw::GLuint primitive_case UNUSED)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Fetch framebuffer. */
	std::vector<glw::GLfloat> pixels(s_framebuffer_size * s_framebuffer_size);

	if ((s_framebuffer_size > 0) && (s_framebuffer_size > 0))
	{
		gl.readPixels(0, 0, s_framebuffer_size, s_framebuffer_size, GL_RED, GL_FLOAT, pixels.data());
		GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels call failed.");
	}

	/* Check results.
	 Note: assuming that s_buffer_size == 2 -> then all points shall be drawn. */
	for (std::vector<glw::GLfloat>::iterator i = pixels.begin(); i != pixels.end(); ++i)
	{
		if (fabs(*i) > 0.0625f /* precision */)
		{
			return false;
		}
	}

	return true;
}